

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

void test_nondecryptable_initial(void)

{
  int iVar1;
  size_t sVar2;
  quicly_conn_t *server;
  iovec packet;
  quicly_decoded_packet_t decoded;
  uint8_t packetbuf [1280];
  
  packet.iov_base = packetbuf;
  packet.iov_len = 0x500;
  packetbuf[0] = 0xc5;
  packetbuf[1] = 0xff;
  packetbuf[2] = '\0';
  packetbuf[3] = '\0';
  packetbuf[4] = '\x1d';
  packetbuf[5] = '\b';
  packetbuf[6] = 0x83;
  packetbuf[7] = 0x94;
  packetbuf[8] = 200;
  packetbuf[9] = 0xf0;
  packetbuf[10] = '>';
  packetbuf[0xb] = 'Q';
  packetbuf[0xc] = 'W';
  packetbuf[0xd] = '\b';
  packetbuf[0xe] = '\0';
  packetbuf[0xf] = '\0';
  packetbuf[0x10] = 'D';
  packetbuf[0x11] = 0xee;
  memset(packetbuf + 0x12,0,0x4ee);
  sVar2 = decode_packets(&decoded,&packet,1);
  _ok((uint)(sVar2 == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x231)
  ;
  new_master_id::master.master_id = new_master_id::master.master_id + 1;
  iVar1 = quicly_accept(&server,&quic_ctx,(sockaddr *)0x0,&fake_address.sa,&decoded,
                        (quicly_address_token_plaintext_t *)0x0,&new_master_id::master,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0xff09),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x235)
  ;
  return;
}

Assistant:

static void test_nondecryptable_initial(void)
{
#define PACKET_LEN 1280
#define HEADER_LEN 18
#define LEN_HIGH (((PACKET_LEN - HEADER_LEN) & 0xff00) >> 8)
#define LEN_LOW ((PACKET_LEN - HEADER_LEN) & 0xff)
    uint8_t header[HEADER_LEN] = {
        /* first byte for Initial: 0b1100???? */
        0xc5,
        /* version (29) */
        0xff,
        0x00,
        0x00,
        0x1d,
        /* DCID len */
        0x08,
        /* DCID */
        0x83,
        0x94,
        0xc8,
        0xf0,
        0x3e,
        0x51,
        0x57,
        0x08,
        /* SCID len */
        0x00,
        /* SCID does not appear */
        /* token length */
        0x00,
        /* token does not appear */
        /* length */
        (0x40 | LEN_HIGH),
        LEN_LOW,
    };
    quicly_conn_t *server;
    uint8_t packetbuf[PACKET_LEN];
    struct iovec packet = {.iov_base = packetbuf, .iov_len = sizeof(packetbuf)};
    size_t num_decoded;
    quicly_decoded_packet_t decoded;
    int ret;

    /* create an Initial packet, with its payload all set to zero */
    memcpy(packetbuf, header, sizeof(header));
    memset(packetbuf + sizeof(header), 0, sizeof(packetbuf) - sizeof(header));
    num_decoded = decode_packets(&decoded, &packet, 1);
    ok(num_decoded == 1);

    /* decryption should fail */
    ret = quicly_accept(&server, &quic_ctx, NULL, &fake_address.sa, &decoded, NULL, new_master_id(), NULL);
    ok(ret == QUICLY_ERROR_DECRYPTION_FAILED);
#undef PACKET_LEN
#undef HEADER_LEN
#undef LEN_HIGH
#undef LEN_LOW
}